

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

subrange clipp::str::
         longest_prefix_match<char,std::char_traits<char>,std::allocator<char>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *prefixes)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar4;
  size_type sVar5;
  subrange sVar6;
  
  pbVar1 = (prefixes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar5 = 0xffffffffffffffff;
  uVar3 = 0;
  for (pbVar4 = (prefixes->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    lVar2 = std::__cxx11::string::find((string *)arg,(ulong)pbVar4);
    if ((lVar2 == 0) && (uVar3 < pbVar4->_M_string_length)) {
      uVar3 = pbVar4->_M_string_length;
      sVar5 = 0;
    }
  }
  sVar6.length_ = uVar3;
  sVar6.at_ = sVar5;
  return sVar6;
}

Assistant:

subrange
longest_prefix_match(const std::basic_string<C,T,A>& arg,
                     const InputRange& prefixes)
{
    using string_t = std::basic_string<C,T,A>;
    using s_size_t = typename string_t::size_type;

    static_assert(traits::is_input_range<InputRange>(),
        "parameter must satisfy the InputRange concept");

    static_assert(std::is_same<string_t,
        typename std::decay<decltype(*begin(prefixes))>::type>(),
        "prefixes must have same type as 'arg'");

    auto i = string_t::npos;
    auto n = s_size_t(0);
    for(const auto& s : prefixes) {
        auto j = arg.find(s);
        if(j == 0 && s.size() > n) {
            i = 0;
            n = s.size();
        }
    }
    return subrange{i,n};
}